

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O0

int compare_components(component_t *u1,component_t *u2)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int res;
  int u2_is_alpha;
  int u1_is_alpha;
  int u2_is_empty;
  int u1_is_empty;
  component_t *u2_local;
  component_t *u1_local;
  
  if (u1->metaorder < u2->metaorder) {
    u1_local._4_4_ = -1;
  }
  else if (u2->metaorder < u1->metaorder) {
    u1_local._4_4_ = 1;
  }
  else {
    bVar5 = u1->start != u1->end;
    bVar6 = u2->start != u2->end;
    if ((bVar5) || (bVar6)) {
      if (bVar5) {
        if (bVar6) {
          iVar3 = my_isalpha(*u1->start);
          iVar4 = my_isalpha(*u2->start);
          if ((iVar3 == 0) || (iVar4 == 0)) {
            if (iVar3 == 0) {
              if (iVar4 == 0) {
                if ((long)u1->end - (long)u1->start < (long)u2->end - (long)u2->start) {
                  u1_local._4_4_ = -1;
                }
                else if ((long)u2->end - (long)u2->start < (long)u1->end - (long)u1->start) {
                  u1_local._4_4_ = 1;
                }
                else {
                  iVar3 = memcmp(u1->start,u2->start,(long)u1->end - (long)u1->start);
                  if (iVar3 < 0) {
                    u1_local._4_4_ = -1;
                  }
                  else if (iVar3 < 1) {
                    u1_local._4_4_ = 0;
                  }
                  else {
                    u1_local._4_4_ = 1;
                  }
                }
              }
              else {
                u1_local._4_4_ = 1;
              }
            }
            else {
              u1_local._4_4_ = -1;
            }
          }
          else {
            cVar1 = my_tolower(*u1->start);
            cVar2 = my_tolower(*u2->start);
            if (cVar1 < cVar2) {
              u1_local._4_4_ = -1;
            }
            else {
              cVar1 = my_tolower(*u1->start);
              cVar2 = my_tolower(*u2->start);
              if (cVar2 < cVar1) {
                u1_local._4_4_ = 1;
              }
              else {
                u1_local._4_4_ = 0;
              }
            }
          }
        }
        else {
          u1_local._4_4_ = 1;
        }
      }
      else {
        u1_local._4_4_ = -1;
      }
    }
    else {
      u1_local._4_4_ = 0;
    }
  }
  return u1_local._4_4_;
}

Assistant:

int compare_components(const component_t* u1, const component_t* u2) {
	/* metaorder has highest priority */
	if (u1->metaorder < u2->metaorder) {
		return -1;
	}
	if (u1->metaorder > u2->metaorder) {
		return 1;
	}

	/* empty strings come before everything */
	int u1_is_empty = u1->start == u1->end;
	int u2_is_empty = u2->start == u2->end;

	if (u1_is_empty && u2_is_empty) {
		return 0;
	}
	if (u1_is_empty) {
		return -1;
	}
	if (u2_is_empty) {
		return 1;
	}

	/* alpha come before numbers  */
	int u1_is_alpha = my_isalpha(*u1->start);
	int u2_is_alpha = my_isalpha(*u2->start);

	if (u1_is_alpha && u2_is_alpha) {
		if (my_tolower(*u1->start) < my_tolower(*u2->start)) {
			return -1;
		}
		if (my_tolower(*u1->start) > my_tolower(*u2->start)) {
			return 1;
		}
		return 0;
	}
	if (u1_is_alpha) {
		return -1;
	}
	if (u2_is_alpha) {
		return 1;
	}

	/* numeric comparison (note that leading zeroes are already trimmed here) */
	if (u1->end - u1->start < u2->end - u2->start) {
		return -1;
	}
	if (u1->end - u1->start > u2->end - u2->start) {
		return 1;
	}

	int res = memcmp(u1->start, u2->start, u1->end - u1->start);
	if (res < 0) {
		return -1;
	}
	if (res > 0) {
		return 1;
	}
	return 0;
}